

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

bool __thiscall tetgenio::load_tetmesh(tetgenio *this,char *filebasename,int object)

{
  bool bVar1;
  
  if (object == 5) {
    bVar1 = load_medit(this,filebasename,1);
    if (bVar1) {
LAB_0010d3ec:
      load_var(this,filebasename);
      load_mtr(this,filebasename);
      return true;
    }
  }
  else {
    bVar1 = load_node(this,filebasename);
    if ((bVar1) && (bVar1 = load_tet(this,filebasename), bVar1)) {
      load_face(this,filebasename);
      load_edge(this,filebasename);
      load_vol(this,filebasename);
      goto LAB_0010d3ec;
    }
  }
  return false;
}

Assistant:

bool tetgenio::load_tetmesh(char* filebasename, int object)
{
  bool success;

  if (object == (int) tetgenbehavior::MEDIT) {
    success = load_medit(filebasename, 1);
  } else {
    success = load_node(filebasename);
    if (success) {
      success = load_tet(filebasename);
    }
    if (success) {
      // Try to load the following files (.face, .edge, .vol).
      load_face(filebasename);
      load_edge(filebasename);
      load_vol(filebasename);
    }
  }

  if (success) {
    // Try to load the following files (.var, .mtr).
    load_var(filebasename);
    load_mtr(filebasename);
  }

  return success;
}